

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O2

int uv_decode(double *up,double *vp,int c)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  
  if (0x3fa0 < (uint)c) {
    return -1;
  }
  iVar2 = 0;
  iVar3 = 0xa3;
  do {
    iVar1 = iVar2;
    do {
      iVar2 = iVar1;
      if (iVar3 + -1 <= iVar2) {
        lVar4 = (long)iVar2;
        iVar1 = iVar2;
        goto LAB_002621f4;
      }
      iVar1 = iVar2 + iVar3 >> 1;
      lVar4 = (long)iVar1;
    } while (uv_row[lVar4].ncum < c);
    iVar3 = iVar1;
  } while (c - uv_row[lVar4].ncum < 0);
LAB_002621f4:
  *up = ((double)(c - uv_row[lVar4].ncum) + 0.5) * 0.0035000001080334187 +
        (double)uv_row[lVar4].ustart;
  *vp = ((double)iVar1 + 0.5) * 0.0035000001080334187 + 0.016939999535679817;
  return 0;
}

Assistant:

int
    uv_decode(double *up, double *vp, int c) /* decode (u',v') index */
{
    int upper, lower;
    register int ui, vi;

    if (c < 0 || c >= UV_NDIVS)
        return (-1);
    lower = 0; /* binary search */
    upper = UV_NVS;
    while (upper - lower > 1)
    {
        vi = (lower + upper) >> 1;
        ui = c - uv_row[vi].ncum;
        if (ui > 0)
            lower = vi;
        else if (ui < 0)
            upper = vi;
        else
        {
            lower = vi;
            break;
        }
    }
    vi = lower;
    ui = c - uv_row[vi].ncum;
    *up = uv_row[vi].ustart + (ui + .5) * UV_SQSIZ;
    *vp = UV_VSTART + (vi + .5) * UV_SQSIZ;
    return (0);
}